

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O2

helix_session_t
helix_session_create(helix_protocol_t proto,helix_event_callback_t callback,void *data)

{
  helix_session_t phVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  phVar1 = (helix_session_t)(**(code **)(*(long *)proto + 0x10))(proto,data);
  local_18 = std::
             _Function_handler<void_(const_helix::event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:91:32)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_helix::event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jvirtanen[P]helix/src/helix.cc:91:32)>
             ::_M_manager;
  local_30._M_unused._0_8_ = phVar1;
  local_30._8_8_ = callback;
  (**(code **)(*(long *)phVar1 + 0x20))(phVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return phVar1;
}

Assistant:

helix_session_t
helix_session_create(helix_protocol_t proto, helix_event_callback_t callback, void *data)
{
    auto session = unwrap(proto)->new_session(data);
    session->register_callback([session, callback](const helix::event& event) {
        callback(wrap(session), wrap(const_cast<helix::event*>(&event)));
    });
    return wrap(session);
}